

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

shared_ptr<vmips::VirtReg> __thiscall vmips::Memory::def(Memory *this)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long *in_RSI;
  undefined1 auVar3 [16];
  shared_ptr<vmips::VirtReg> sVar4;
  
  pcVar1 = (char *)(**(code **)(*in_RSI + 8))();
  if (*pcVar1 != 'l') {
    auVar3 = (**(code **)(*in_RSI + 8))();
    _Var2._M_pi = auVar3._8_8_;
    if (*(char *)(auVar3._0_8_ + 1) != 'l') {
      (this->super_Instruction)._vptr_Instruction = (_func_int **)0x0;
      (this->target).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_00122dd6;
    }
  }
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 1));
  _Var2._M_pi = extraout_RDX;
LAB_00122dd6:
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> Memory::def() const {
    if (name()[0] == 'l' || name()[1] == 'l') {
        return target;
    }
    return nullptr;
}